

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int s2pred::TriageCompareEdgeDirections<double>
              (Vector3<double> *a0,Vector3<double> *a1,Vector3<double> *b0,Vector3<double> *b1)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar10;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar3 = a0->c_[2] - a1->c_[2];
  dVar4 = a0->c_[0] - a1->c_[0];
  dVar13 = a0->c_[0] + a1->c_[0];
  dVar14 = a0->c_[1] + a1->c_[1];
  dVar15 = b0->c_[2] - b1->c_[2];
  dVar16 = b0->c_[0] - b1->c_[0];
  dVar7 = a1->c_[2] + a0->c_[2];
  dVar10 = b1->c_[2] + b0->c_[2];
  dVar11 = b0->c_[0] + b1->c_[0];
  dVar12 = b0->c_[1] + b1->c_[1];
  dVar5 = a0->c_[1] - a1->c_[1];
  dVar6 = b0->c_[1] - b1->c_[1];
  dVar2 = dVar3 * dVar13 - dVar4 * dVar7;
  dVar4 = dVar4 * dVar14 - dVar5 * dVar13;
  dVar7 = dVar5 * dVar7 - dVar3 * dVar14;
  dVar13 = dVar6 * dVar10 - dVar15 * dVar12;
  dVar3 = dVar15 * dVar11 - dVar16 * dVar10;
  dVar5 = dVar16 * dVar12 - dVar6 * dVar11;
  auVar8._0_8_ = dVar2 * dVar2 + dVar7 * dVar7;
  auVar8._8_8_ = dVar3 * dVar3 + dVar13 * dVar13;
  auVar9._8_8_ = dVar5 * dVar5 + auVar8._8_8_;
  auVar9._0_8_ = dVar4 * dVar4 + auVar8._0_8_;
  auVar9 = sqrtpd(auVar8,auVar9);
  dVar6 = ((auVar9._8_8_ + auVar9._0_8_) * 6.153480596427404e-15 +
          auVar9._0_8_ * 11.928203230275509 * auVar9._8_8_) * 1.1102230246251565e-16;
  dVar2 = dVar5 * dVar4 + dVar13 * dVar7 + 0.0 + dVar3 * dVar2;
  iVar1 = 1;
  if (dVar2 <= dVar6) {
    iVar1 = -(uint)(dVar2 < -dVar6);
  }
  return iVar1;
}

Assistant:

D operator-(const D& b) const { return D(AsD()) -= b; }